

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt(IEEEFloat *this)

{
  undefined2 uVar1;
  fltSemantics *pfVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  uint64_t *puVar6;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar7;
  byte local_d4;
  byte local_d3;
  byte local_d1;
  ArrayRef<unsigned_long> local_b8;
  undefined1 local_a8 [24];
  IEEEFloat v;
  undefined1 local_70 [8];
  IEEEFloat u;
  IEEEFloat extended;
  undefined4 uStack_38;
  fltSemantics extendedSemantics;
  bool losesInfo;
  uint64_t uStack_28;
  opStatus fs;
  uint64_t words [2];
  IEEEFloat *this_local;
  
  if (in_RSI->semantics != (fltSemantics *)semPPCDoubleDoubleLegacy) {
    __assert_fail("semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb0e,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  uVar5 = partCount(in_RSI);
  if (uVar5 != 2) {
    __assert_fail("partCount()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb0f,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  pfVar2 = in_RSI->semantics;
  uVar1 = pfVar2->maxExponent;
  uVar3 = pfVar2->precision;
  extendedSemantics._0_4_ = pfVar2->sizeInBits;
  stack0xffffffffffffffc4 = CONCAT44(uVar3,(BADTYPE)CONCAT22(0xfc02,uVar1));
  IEEEFloat((IEEEFloat *)&u.exponent,in_RSI);
  extendedSemantics.sizeInBits =
       convert((IEEEFloat *)&u.exponent,(fltSemantics *)&extended.field_0x14,rmNearestTiesToEven,
               (bool *)((long)&extendedSemantics.precision + 3));
  local_d1 = 0;
  if (extendedSemantics.sizeInBits == opOK) {
    local_d1 = extendedSemantics.precision._3_1_ ^ 0xff;
  }
  if ((local_d1 & 1) == 0) {
    __assert_fail("fs == opOK && !losesInfo",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb1f,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  IEEEFloat((IEEEFloat *)local_70,(IEEEFloat *)&u.exponent);
  extendedSemantics.sizeInBits =
       convert((IEEEFloat *)local_70,(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,
               (bool *)((long)&extendedSemantics.precision + 3));
  if (extendedSemantics.sizeInBits != opOK && extendedSemantics.sizeInBits != opInexact) {
    __assert_fail("fs == opOK || fs == opInexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb24,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  convertDoubleAPFloatToAPInt((IEEEFloat *)&v.exponent);
  puVar6 = APInt::getRawData((APInt *)&v.exponent);
  uStack_28 = *puVar6;
  APInt::~APInt((APInt *)&v.exponent);
  bVar4 = isFiniteNonZero((IEEEFloat *)local_70);
  if ((bVar4) && ((extendedSemantics.precision._3_1_ & 1) != 0)) {
    extendedSemantics.sizeInBits =
         convert((IEEEFloat *)local_70,(fltSemantics *)&extended.field_0x14,rmNearestTiesToEven,
                 (bool *)((long)&extendedSemantics.precision + 3));
    local_d3 = 0;
    if (extendedSemantics.sizeInBits == opOK) {
      local_d3 = extendedSemantics.precision._3_1_ ^ 0xff;
    }
    if ((local_d3 & 1) == 0) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb2e,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    IEEEFloat((IEEEFloat *)(local_a8 + 0x10),(IEEEFloat *)&u.exponent);
    subtract((IEEEFloat *)(local_a8 + 0x10),(IEEEFloat *)local_70,rmNearestTiesToEven);
    extendedSemantics.sizeInBits =
         convert((IEEEFloat *)(local_a8 + 0x10),(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,
                 (bool *)((long)&extendedSemantics.precision + 3));
    local_d4 = 0;
    if (extendedSemantics.sizeInBits == opOK) {
      local_d4 = extendedSemantics.precision._3_1_ ^ 0xff;
    }
    if ((local_d4 & 1) == 0) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb34,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    convertDoubleAPFloatToAPInt((IEEEFloat *)local_a8);
    puVar6 = APInt::getRawData((APInt *)local_a8);
    words[0] = *puVar6;
    APInt::~APInt((APInt *)local_a8);
    ~IEEEFloat((IEEEFloat *)(local_a8 + 0x10));
  }
  else {
    words[0] = 0;
  }
  ArrayRef<unsigned_long>::ArrayRef<2ul>(&local_b8,(unsigned_long (*) [2])&stack0xffffffffffffffd8);
  APInt::APInt((APInt *)this,0x80,local_b8);
  ~IEEEFloat((IEEEFloat *)local_70);
  ~IEEEFloat((IEEEFloat *)&u.exponent);
  AVar7._8_8_ = extraout_RDX;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy);
  assert(partCount()==2);

  uint64_t words[2];
  opStatus fs;
  bool losesInfo;

  // Convert number to double.  To avoid spurious underflows, we re-
  // normalize against the "double" minExponent first, and only *then*
  // truncate the mantissa.  The result of that second conversion
  // may be inexact, but should never underflow.
  // Declare fltSemantics before APFloat that uses it (and
  // saves pointer to it) to ensure correct destruction order.
  fltSemantics extendedSemantics = *semantics;
  extendedSemantics.minExponent = semIEEEdouble.minExponent;
  IEEEFloat extended(*this);
  fs = extended.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK && !losesInfo);
  (void)fs;

  IEEEFloat u(extended);
  fs = u.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK || fs == opInexact);
  (void)fs;
  words[0] = *u.convertDoubleAPFloatToAPInt().getRawData();

  // If conversion was exact or resulted in a special case, we're done;
  // just set the second double to zero.  Otherwise, re-convert back to
  // the extended format and compute the difference.  This now should
  // convert exactly to double.
  if (u.isFiniteNonZero() && losesInfo) {
    fs = u.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;

    IEEEFloat v(extended);
    v.subtract(u, rmNearestTiesToEven);
    fs = v.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;
    words[1] = *v.convertDoubleAPFloatToAPInt().getRawData();
  } else {
    words[1] = 0;
  }

  return APInt(128, words);
}